

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall
kj::HttpHeaders::clone(HttpHeaders *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Vector<kj::HttpHeaders::Header> *this_00;
  HttpHeaderTable *pHVar1;
  Header *pHVar2;
  StringPtr *pSVar3;
  Header *pHVar4;
  Header *pHVar5;
  ulong newSize;
  long lVar6;
  ulong uVar7;
  long lVar8;
  StringPtr SVar9;
  StringPtr str;
  StringPtr str_00;
  
  pHVar1 = *(HttpHeaderTable **)__fn;
  this->table = pHVar1;
  uVar7 = (ulong)((long)(pHVar1->namesById).builder.pos - (long)(pHVar1->namesById).builder.ptr) >>
          4 & 0xffffffff;
  pSVar3 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,uVar7,uVar7,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
  (this->indexedHeaders).ptr = pSVar3;
  (this->indexedHeaders).size_ = uVar7;
  (this->indexedHeaders).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  (this->unindexedHeaders).builder.ptr = (Header *)0x0;
  (this->unindexedHeaders).builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  pHVar4 = (Header *)0x0;
  (this->unindexedHeaders).builder.endPtr = (Header *)0x0;
  (this->ownedStrings).builder.ptr = (Array<char> *)0x0;
  (this->ownedStrings).builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
  (this->ownedStrings).builder.endPtr = (Array<char> *)0x0;
  lVar8 = *(long *)(__fn + 0x10);
  pHVar5 = (Header *)0x0;
  if (lVar8 != 0) {
    lVar6 = 8;
    do {
      uVar7 = *(ulong *)(*(long *)(__fn + 8) + lVar6);
      if (1 < uVar7) {
        SVar9.content.size_ = uVar7;
        SVar9.content.ptr = *(char **)(*(long *)(__fn + 8) + -8 + lVar6);
        SVar9 = cloneToOwn(this,SVar9);
        pSVar3 = (this->indexedHeaders).ptr;
        *(char **)((long)pSVar3 + lVar6 + -8) = SVar9.content.ptr;
        *(size_t *)((long)&(pSVar3->content).ptr + lVar6) = SVar9.content.size_;
      }
      lVar6 = lVar6 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    pHVar4 = (this->unindexedHeaders).builder.ptr;
    pHVar5 = (this->unindexedHeaders).builder.endPtr;
  }
  this_00 = &this->unindexedHeaders;
  uVar7 = *(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5;
  if ((ulong)((long)pHVar5 - (long)pHVar4) <
      (ulong)(*(long *)(__fn + 0x28) - *(long *)(__fn + 0x20))) {
    newSize = 4;
    if (pHVar5 != pHVar4) {
      newSize = (long)pHVar5 - (long)pHVar4 >> 4;
    }
    if (newSize < uVar7) {
      newSize = uVar7;
    }
    Vector<kj::HttpHeaders::Header>::setCapacity(this_00,newSize);
    pHVar4 = (this_00->builder).ptr;
  }
  pHVar5 = pHVar4 + uVar7;
  pHVar2 = (this->unindexedHeaders).builder.pos;
  while (pHVar2 < pHVar4 + uVar7) {
    (pHVar2->name).content.ptr = "";
    (pHVar2->name).content.size_ = 1;
    (pHVar2->value).content.ptr = "";
    (pHVar2->value).content.size_ = 1;
    pHVar5 = pHVar2 + 1;
    pHVar2 = pHVar5;
  }
  (this->unindexedHeaders).builder.pos = pHVar5;
  if (*(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) != 0) {
    lVar8 = *(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5;
    lVar6 = 0;
    do {
      str.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 8 + lVar6);
      str.content.ptr = *(char **)(*(long *)(__fn + 0x20) + lVar6);
      SVar9 = cloneToOwn(this,str);
      pHVar5 = (this->unindexedHeaders).builder.ptr;
      *(char **)((long)&(pHVar5->name).content.ptr + lVar6) = SVar9.content.ptr;
      *(size_t *)((long)&(pHVar5->name).content.size_ + lVar6) = SVar9.content.size_;
      str_00.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 0x18 + lVar6);
      str_00.content.ptr = *(char **)(*(long *)(__fn + 0x20) + 0x10 + lVar6);
      SVar9 = cloneToOwn(this,str_00);
      pHVar5 = (this_00->builder).ptr;
      *(char **)((long)&(pHVar5->value).content.ptr + lVar6) = SVar9.content.ptr;
      *(size_t *)((long)&(pHVar5->value).content.size_ + lVar6) = SVar9.content.size_;
      lVar6 = lVar6 + 0x20;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return (int)this;
}

Assistant:

HttpHeaders HttpHeaders::clone() const {
  HttpHeaders result(*table);

  for (auto i: kj::indices(indexedHeaders)) {
    if (indexedHeaders[i] != nullptr) {
      result.indexedHeaders[i] = result.cloneToOwn(indexedHeaders[i]);
    }
  }

  result.unindexedHeaders.resize(unindexedHeaders.size());
  for (auto i: kj::indices(unindexedHeaders)) {
    result.unindexedHeaders[i].name = result.cloneToOwn(unindexedHeaders[i].name);
    result.unindexedHeaders[i].value = result.cloneToOwn(unindexedHeaders[i].value);
  }

  return result;
}